

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O2

ktx_error_code_e
ktxTexture2_CreateFromMemory
          (ktx_uint8_t *bytes,ktx_size_t size,ktxTextureCreateFlags createFlags,ktxTexture2 **newTex
          )

{
  ktx_error_code_e kVar1;
  ktxTexture2 *This;
  ktxStream kStack_98;
  
  if (newTex == (ktxTexture2 **)0x0) {
    return KTX_INVALID_VALUE;
  }
  This = (ktxTexture2 *)malloc(0xa8);
  if (This == (ktxTexture2 *)0x0) {
    return KTX_OUT_OF_MEMORY;
  }
  if (size == 0 || bytes == (ktx_uint8_t *)0x0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else {
    kVar1 = ktxMemStream_construct_ro(&kStack_98,bytes,size);
    if ((kVar1 == KTX_SUCCESS) &&
       (kVar1 = ktxTexture2_constructFromStream(This,&kStack_98,createFlags), kVar1 == KTX_SUCCESS))
    {
      kVar1 = KTX_SUCCESS;
      goto LAB_001bca5b;
    }
  }
  free(This);
  This = (ktxTexture2 *)0x0;
LAB_001bca5b:
  *newTex = This;
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture2_CreateFromMemory(const ktx_uint8_t* bytes, ktx_size_t size,
                             ktxTextureCreateFlags createFlags,
                             ktxTexture2** newTex)
{
    KTX_error_code result;
    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture2* tex = (ktxTexture2*)malloc(sizeof(ktxTexture2));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture2_constructFromMemory(tex, bytes, size,
                                             createFlags);
    if (result == KTX_SUCCESS)
        *newTex = (ktxTexture2*)tex;
    else {
        free(tex);
        *newTex = NULL;
    }
    return result;
}